

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderView::mouseMoveEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  QHeaderViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  QObject *pQVar3;
  QWidget *this_01;
  long lVar4;
  QWidgetData *pQVar5;
  QArrayData *pQVar6;
  bool bVar7;
  ResizeMode RVar8;
  undefined4 uVar9;
  LayoutDirection LVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  undefined8 uVar19;
  int iVar20;
  QPoint QVar21;
  long in_FS_OFFSET;
  double dVar22;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar27 [16];
  QStatusTipEvent tip;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  long local_98;
  QArrayData *local_88;
  undefined8 uStack_80;
  long local_78;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  auVar27 = QEventPoint::position();
  dVar26 = auVar27._0_8_;
  if (OVar1 != Horizontal) {
    dVar26 = auVar27._8_8_;
  }
  dVar26 = (double)((ulong)dVar26 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar26;
  dVar22 = 2147483647.0;
  if (dVar26 <= 2147483647.0) {
    dVar22 = dVar26;
  }
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  iVar17 = (int)dVar22;
  if ((iVar17 < 0) && (this_00->state != SelectSections)) goto switchD_00558c7b_default;
  if (*(int *)(e + 0x44) == 0) {
    this_00->state = NoState;
    this_00->firstPressed = -1;
    this_00->pressed = -1;
  }
  switch(this_00->state) {
  case NoState:
    iVar16 = QHeaderViewPrivate::sectionHandleAt(this_00,iVar17);
    bVar7 = QWidget::testAttribute_helper((QWidget *)this,WA_SetCursor);
    if ((iVar16 == -1) || (RVar8 = sectionResizeMode(this,iVar16), RVar8 != Interactive)) {
      if (bVar7) {
        QWidget::unsetCursor((QWidget *)this);
      }
      iVar17 = logicalIndexAt(this,iVar17);
      local_88 = (QArrayData *)0x0;
      uStack_80 = 0;
      local_78 = 0;
      if (iVar17 != -1) {
        pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar2 + 0xa0))(&local_68,pQVar2,iVar17,this_00->orientation,4);
        ::QVariant::toString();
        pQVar6 = local_88;
        local_88 = local_a8;
        uStack_80 = uStack_a0;
        local_78 = local_98;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,2,0x10);
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_68);
      }
      if (((this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip != false) ||
         (local_78 != 0)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_68.data,(QString *)&local_88);
        pQVar3 = *(QObject **)
                  &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   super_QFramePrivate.super_QWidgetPrivate.field_0x10;
        if (pQVar3 != (QObject *)0x0) {
          this = (QHeaderView *)pQVar3;
        }
        QCoreApplication::sendEvent((QObject *)this,(QEvent *)local_68.data);
        (this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip = local_78 != 0;
        QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_68.data);
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
    }
    else if (!bVar7) {
      QCursor::QCursor((QCursor *)&local_68.shared,
                       (this_00->orientation == Horizontal) + SplitVCursor);
      QWidget::setCursor((QWidget *)this,(QCursor *)&local_68.shared);
      QCursor::~QCursor((QCursor *)&local_68.shared);
    }
    break;
  case ResizeSection:
    if (this_00->cascadingResizing == true) {
      if ((this_00->orientation == Horizontal) &&
         (LVar10 = QWidget::layoutDirection
                             (*(QWidget **)
                               &(this_00->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
        iVar16 = this_00->lastPos - iVar17;
      }
      else {
        iVar16 = iVar17 - this_00->lastPos;
      }
      uVar13 = visualIndex(this,this_00->section);
      if (this_00->headerMode == InitialNoSectionMemoryUsage) {
        uVar14 = this_00->defaultSectionSize;
      }
      else {
        uVar14 = 0xffffffff;
        if ((-1 < (int)uVar13) && ((int)uVar13 < (int)(this_00->sectionItems).d.size)) {
          uVar14 = *(uint *)((this_00->sectionItems).d.ptr + uVar13) & 0xfffff;
        }
      }
      QHeaderViewPrivate::cascadingResize(this_00,uVar13,uVar14 + iVar16);
    }
    else {
      if ((this_00->orientation == Horizontal) &&
         (LVar10 = QWidget::layoutDirection
                             (*(QWidget **)
                               &(this_00->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
        iVar16 = this_00->firstPos - iVar17;
      }
      else {
        iVar16 = iVar17 - this_00->firstPos;
      }
      iVar11 = minimumSectionSize(this);
      iVar16 = iVar16 + this_00->originalSize;
      iVar12 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                  super_QFrame.super_QWidget.field_0x8 + 0x608);
      iVar20 = 0xfffff;
      if (iVar12 != -1) {
        iVar20 = iVar12;
      }
      if (iVar16 <= iVar20) {
        iVar20 = iVar16;
      }
      if (iVar20 < iVar11) {
        iVar20 = iVar11;
      }
      resizeSection(this,this_00->section,iVar20);
    }
    this_00->lastPos = iVar17;
    break;
  case MoveSection:
    uVar9 = QEventPoint::position();
    auVar27._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar27._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar27 = minpd(_DAT_0066f5d0,auVar27);
    auVar23._8_8_ = -(ulong)(-2147483648.0 < auVar27._8_8_);
    auVar23._0_8_ = -(ulong)(-2147483648.0 < auVar27._0_8_);
    uVar13 = movmskpd(uVar9,auVar23);
    uVar18 = 0x8000000000000000;
    if ((uVar13 & 1) != 0) {
      uVar18 = (ulong)(uint)(int)auVar27._0_8_ << 0x20;
    }
    uVar15 = 0x80000000;
    if ((uVar13 & 2) != 0) {
      uVar15 = (ulong)(uint)(int)auVar27._8_8_;
    }
    local_68.shared = (PrivateShared *)(uVar15 | uVar18);
    bVar7 = QAbstractItemViewPrivate::shouldAutoScroll
                      (&this_00->super_QAbstractItemViewPrivate,(QPoint *)&local_68.shared);
    if (bVar7) {
      uVar9 = QEventPoint::position();
      auVar24._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_00;
      auVar24._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_00;
      auVar27 = minpd(_DAT_0066f5d0,auVar24);
      auVar25._8_8_ = -(ulong)(-2147483648.0 < auVar27._8_8_);
      auVar25._0_8_ = -(ulong)(-2147483648.0 < auVar27._0_8_);
      uVar13 = movmskpd(uVar9,auVar25);
      iVar16 = (int)auVar27._8_8_;
      if ((uVar13 & 2) == 0) {
        iVar16 = -0x80000000;
      }
      iVar12 = (int)auVar27._0_8_;
      if ((uVar13 & 1) == 0) {
        iVar12 = -0x80000000;
      }
      this_01 = *(QWidget **)
                 &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  super_QFramePrivate.super_QWidgetPrivate.field_0x8;
      LVar10 = QWidget::layoutDirection(this_01);
      iVar11 = (**(code **)(*(long *)this_01 + 0x2b0))(this_01);
      iVar20 = -iVar11;
      if (LVar10 != RightToLeft) {
        iVar20 = iVar11;
      }
      iVar11 = (**(code **)(*(long *)this_01 + 0x2b8))(this_01);
      QVar21.xp.m_i = iVar20 + iVar16;
      QVar21.yp.m_i = iVar11 + iVar12;
      (this_00->super_QAbstractItemViewPrivate).draggedPosition = QVar21;
      uVar19 = 50000000;
      if ((this_00->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
        uVar19 = 150000000;
      }
      QBasicTimer::start(&(this_00->super_QAbstractItemViewPrivate).autoScrollTimer,uVar19,1,
                         *(undefined8 *)
                          &(this_00->super_QAbstractItemViewPrivate).
                           super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                           .field_0x8);
      (this_00->super_QAbstractItemViewPrivate).autoScrollCount = 0;
    }
    iVar12 = iVar17 - this_00->firstPos;
    iVar16 = -iVar12;
    if (0 < iVar12) {
      iVar16 = iVar12;
    }
    iVar12 = QApplication::startDragDistance();
    if (((iVar16 < iVar12) &&
        ((((this_00->sectionIndicator->super_QFrame).super_QWidget.data)->widget_attributes &
         0x10000) != 0)) || (uVar13 = visualIndexAt(this,iVar17), uVar13 == 0xffffffff)) break;
    if (uVar13 == 0) {
      lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8;
      if (*(int *)(lVar4 + 0x650) == 0) {
        iVar16 = (int)*(undefined8 *)(lVar4 + 0x658);
      }
      else {
        iVar16 = (int)*(undefined8 *)(lVar4 + 0x648);
      }
      if (*(int *)(lVar4 + 0x650) == 0 || iVar16 < 1) {
        iVar16 = -(uint)(iVar16 < 1);
      }
      else if (*(long *)(lVar4 + 0x580) == 0) {
        iVar16 = 0;
      }
      else {
        iVar16 = **(int **)(lVar4 + 0x578);
      }
      if ((iVar16 == 0) && (this_00->allowUserMoveOfSection0 != true)) break;
    }
    iVar16 = QHeaderViewPrivate::headerSectionPosition(this_00,uVar13);
    if (this_00->headerMode == InitialNoSectionMemoryUsage) {
      uVar14 = this_00->defaultSectionSize;
    }
    else {
      uVar14 = 0xffffffff;
      if ((-1 < (int)uVar13) && ((int)uVar13 < (int)(this_00->sectionItems).d.size)) {
        uVar14 = *(uint *)((this_00->sectionItems).d.ptr + uVar13) & 0xfffff;
      }
    }
    iVar12 = this_00->headerOffset;
    iVar20 = iVar17;
    if ((this_00->orientation == Horizontal) &&
       (LVar10 = QWidget::layoutDirection
                           (*(QWidget **)
                             &(this_00->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                              super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
      pQVar5 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      iVar20 = ((pQVar5->crect).x2.m_i - ((pQVar5->crect).x1.m_i + iVar17)) + 1;
    }
    iVar12 = (int)uVar14 / 2 + (iVar16 - iVar12);
    iVar16 = visualIndex(this,this_00->section);
    uVar14 = this_00->target;
    if ((int)uVar13 < iVar16) {
      if (iVar12 <= iVar20) {
        uVar13 = uVar13 + 1;
      }
LAB_00559373:
      if ((this_00->logicalIndices).d.size != 0) {
        uVar13 = (this_00->logicalIndices).d.ptr[(int)uVar13];
      }
    }
    else {
      if (iVar16 < (int)uVar13) {
        if (iVar20 <= iVar12) {
          uVar13 = uVar13 - 1;
        }
        goto LAB_00559373;
      }
      uVar13 = this_00->section;
    }
    this_00->target = uVar13;
    if ((uVar14 == 0xffffffff) || (uVar14 != uVar13)) {
      QHeaderViewPrivate::updateSectionsBeforeAfter(this_00,uVar13);
    }
    QHeaderViewPrivate::updateSectionIndicator(this_00,this_00->section,iVar17);
    break;
  case SelectSections:
    iVar16 = -this_00->headerOffset;
    if (-this_00->headerOffset <= iVar17) {
      iVar16 = iVar17;
    }
    uVar13 = logicalIndexAt(this,iVar16);
    if ((0 < iVar17) && (uVar13 == 0xffffffff)) {
      uVar14 = QHeaderViewPrivate::lastVisibleVisualIndex(this_00);
      if ((int)uVar14 < 0) {
        uVar13 = 0xffffffff;
      }
      else {
        lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8;
        if (*(int *)(lVar4 + 0x650) == 0) {
          iVar17 = (int)*(undefined8 *)(lVar4 + 0x658);
        }
        else {
          iVar17 = (int)*(undefined8 *)(lVar4 + 0x648);
        }
        uVar13 = 0xffffffff;
        if ((int)uVar14 < iVar17) {
          uVar13 = uVar14;
        }
        if (((*(int *)(lVar4 + 0x650) != 0) && ((int)uVar14 < iVar17)) &&
           (uVar13 = uVar14, *(long *)(lVar4 + 0x580) != 0)) {
          uVar13 = *(uint *)(*(long *)(lVar4 + 0x578) + (ulong)uVar14 * 4);
        }
      }
    }
    uVar14 = this_00->pressed;
    if (uVar13 != uVar14) {
      if (uVar14 != 0xffffffff) {
        updateSection(this,uVar14);
      }
      this_00->pressed = uVar13;
      if ((uVar13 != 0xffffffff) && (this_00->clickableSections != false)) {
        local_68._8_8_ = &local_88;
        local_88 = (QArrayData *)CONCAT44(local_88._4_4_,uVar13);
        local_68.shared = (PrivateShared *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_68.shared);
        updateSection(this,this_00->pressed);
      }
    }
  }
switchD_00558c7b_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    const int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    if (pos < 0 && d->state != QHeaderViewPrivate::SelectSections)
        return;
    if (e->buttons() == Qt::NoButton) {
        // Under Cocoa, when the mouse button is released, may include an extra
        // simulated mouse moved event. The state of the buttons when this event
        // is generated is already "no button" and the code below gets executed
        // just before the mouseReleaseEvent and resets the state. This prevents
        // column dragging from working. So this code is disabled under Cocoa.
        d->state = QHeaderViewPrivate::NoState;
        d->firstPressed = d->pressed = -1;
    }
    switch (d->state) {
        case QHeaderViewPrivate::ResizeSection: {
            Q_ASSERT(d->originalSize != -1);
            if (d->cascadingResizing) {
                int delta = d->reverse() ? d->lastPos - pos : pos - d->lastPos;
                int visual = visualIndex(d->section);
                d->cascadingResize(visual, d->headerSectionSize(visual) + delta);
            } else {
                int delta = d->reverse() ? d->firstPos - pos : pos - d->firstPos;
                int newsize = qBound(minimumSectionSize(), d->originalSize + delta, maximumSectionSize());
                resizeSection(d->section, newsize);
            }
            d->lastPos = pos;
            return;
        }
        case QHeaderViewPrivate::MoveSection: {
            if (d->shouldAutoScroll(e->position().toPoint())) {
                d->draggedPosition = e->pos() + d->offset();
                d->startAutoScroll();
            }
            if (qAbs(pos - d->firstPos) >= QApplication::startDragDistance()
#if QT_CONFIG(label)
                || !d->sectionIndicator->isHidden()
#endif
                ) {
                int visual = visualIndexAt(pos);
                if (visual == -1)
                    return;
                if (visual == 0 && logicalIndex(0) == 0 && !d->allowUserMoveOfSection0)
                    return;

                const int posThreshold = d->headerSectionPosition(visual) - d->headerOffset + d->headerSectionSize(visual) / 2;
                const int checkPos = d->reverse() ? d->viewport->width() - pos : pos;
                int moving = visualIndex(d->section);
                int oldTarget = d->target;
                if (visual < moving) {
                    if (checkPos < posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual + 1);
                } else if (visual > moving) {
                    if (checkPos > posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual - 1);
                } else {
                    d->target = d->section;
                }
                if (oldTarget != d->target || oldTarget == -1)
                    d->updateSectionsBeforeAfter(d->target);
                d->updateSectionIndicator(d->section, pos);
            }
            return;
        }
        case QHeaderViewPrivate::SelectSections: {
            int logical = logicalIndexAt(qMax(-d->headerOffset, pos));
            if (logical == -1 && pos > 0)
                logical = logicalIndex(d->lastVisibleVisualIndex());
            if (logical == d->pressed)
                return; // nothing to do
            else if (d->pressed != -1)
                updateSection(d->pressed);
            d->pressed = logical;
            if (d->clickableSections && logical != -1) {
                emit sectionEntered(d->pressed);
                updateSection(d->pressed);
            }
            return;
        }
        case QHeaderViewPrivate::NoState: {
#ifndef QT_NO_CURSOR
            int handle = d->sectionHandleAt(pos);
            bool hasCursor = testAttribute(Qt::WA_SetCursor);
            if (handle != -1 && (sectionResizeMode(handle) == Interactive)) {
                if (!hasCursor)
                    setCursor(d->orientation == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor);
            } else {
                if (hasCursor)
                    unsetCursor();
#ifndef QT_NO_STATUSTIP
                int logical = logicalIndexAt(pos);
                QString statusTip;
                if (logical != -1)
                    statusTip = d->model->headerData(logical, d->orientation, Qt::StatusTipRole).toString();
                if (d->shouldClearStatusTip || !statusTip.isEmpty()) {
                    QStatusTipEvent tip(statusTip);
                    QCoreApplication::sendEvent(d->parent ? d->parent : this, &tip);
                    d->shouldClearStatusTip = !statusTip.isEmpty();
                }
#endif // !QT_NO_STATUSTIP
            }
#endif
            return;
        }
        default:
            break;
    }
}